

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QOpenFileLineEdit.cpp
# Opt level: O0

void QOpenFileLineEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  ActionPosition *pAVar2;
  ActionPosition AVar3;
  Options OVar4;
  QList<QString> *this;
  QOpenFileLineEdit *this_00;
  undefined8 *in_RCX;
  uint in_EDX;
  int in_ESI;
  QOpenFileLineEdit *in_RDI;
  void *_v_1;
  QOpenFileLineEdit *_t_2;
  void *_v;
  QOpenFileLineEdit *_t_1;
  int *result;
  QOpenFileLineEdit *_t;
  QOpenFileLineEdit *in_stack_ffffffffffffff38;
  QOpenFileLineEdit *in_stack_ffffffffffffff40;
  ActionPosition in_stack_ffffffffffffff4c;
  QOpenFileLineEdit *in_stack_ffffffffffffff50;
  
  if (in_ESI == 0) {
    if (in_EDX == 0) {
      embededActionPositionChanged(in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
    }
    else if (in_EDX == 1) {
      filePathChanged(in_stack_ffffffffffffff50,(QString *)CONCAT44(in_stack_ffffffffffffff4c,1));
    }
  }
  else if (in_ESI == 5) {
    pcVar1 = *(code **)in_RCX[1];
    if (pcVar1 == embededActionPositionChanged &&
        (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
      *(undefined4 *)*in_RCX = 0;
    }
    else {
      pcVar1 = *(code **)in_RCX[1];
      if (pcVar1 == filePathChanged && (pcVar1 == (code *)0x0 || ((long *)in_RCX[1])[1] == 0)) {
        *(undefined4 *)*in_RCX = 1;
      }
    }
  }
  else if (in_ESI == 1) {
    pAVar2 = (ActionPosition *)*in_RCX;
    this = (QList<QString> *)(ulong)in_EDX;
    switch(this) {
    case (QList<QString> *)0x0:
      AVar3 = embededActionPosition(in_RDI);
      *pAVar2 = AVar3;
      break;
    case (QList<QString> *)0x1:
      filePath(in_stack_ffffffffffffff38);
      QString::operator=((QString *)this,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x1d6d0e);
      break;
    case (QList<QString> *)0x2:
      caption(in_stack_ffffffffffffff38);
      QString::operator=((QString *)this,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x1d6d41);
      break;
    case (QList<QString> *)0x3:
      directory(in_stack_ffffffffffffff38);
      QString::operator=((QString *)this,(QString *)in_stack_ffffffffffffff38);
      QString::~QString((QString *)0x1d6d74);
      break;
    case (QList<QString> *)0x4:
      filter(in_stack_ffffffffffffff38);
      QList<QString>::operator=(this,(QList<QString> *)in_stack_ffffffffffffff38);
      QList<QString>::~QList((QList<QString> *)0x1d6da4);
      break;
    case (QList<QString> *)0x5:
      OVar4 = options(in_stack_ffffffffffffff38);
      *pAVar2 = OVar4.i;
    }
  }
  else if (in_ESI == 2) {
    this_00 = (QOpenFileLineEdit *)(ulong)in_EDX;
    switch(this_00) {
    case (QOpenFileLineEdit *)0x0:
      setEmbededActionPosition(in_stack_ffffffffffffff40,LeadingPosition);
      break;
    case (QOpenFileLineEdit *)0x1:
      setFilePath(in_stack_ffffffffffffff40,(QString *)this_00);
      break;
    case (QOpenFileLineEdit *)0x2:
      setCaption(in_stack_ffffffffffffff40,(QString *)this_00);
      break;
    case (QOpenFileLineEdit *)0x3:
      setDirectory(in_stack_ffffffffffffff40,(QString *)this_00);
      break;
    case (QOpenFileLineEdit *)0x4:
      setFilter(in_stack_ffffffffffffff40,(QStringList *)this_00);
      break;
    case (QOpenFileLineEdit *)0x5:
      setOptions(this_00,(Options)(Int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
    }
  }
  return;
}

Assistant:

void QOpenFileLineEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<QOpenFileLineEdit *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->embededActionPositionChanged((*reinterpret_cast< std::add_pointer_t<QLineEdit::ActionPosition>>(_a[1]))); break;
        case 1: _t->filePathChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (QOpenFileLineEdit::*)(QLineEdit::ActionPosition );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFileLineEdit::embededActionPositionChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (QOpenFileLineEdit::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&QOpenFileLineEdit::filePathChanged)) {
                *result = 1;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<QOpenFileLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QLineEdit::ActionPosition*>(_v) = _t->embededActionPosition(); break;
        case 1: *reinterpret_cast< QString*>(_v) = _t->filePath(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->caption(); break;
        case 3: *reinterpret_cast< QString*>(_v) = _t->directory(); break;
        case 4: *reinterpret_cast< QStringList*>(_v) = _t->filter(); break;
        case 5: *reinterpret_cast< QFileDialog::Options*>(_v) = _t->options(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<QOpenFileLineEdit *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setEmbededActionPosition(*reinterpret_cast< QLineEdit::ActionPosition*>(_v)); break;
        case 1: _t->setFilePath(*reinterpret_cast< QString*>(_v)); break;
        case 2: _t->setCaption(*reinterpret_cast< QString*>(_v)); break;
        case 3: _t->setDirectory(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setFilter(*reinterpret_cast< QStringList*>(_v)); break;
        case 5: _t->setOptions(*reinterpret_cast< QFileDialog::Options*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}